

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<curi_status_const&>::
captureExpression<(Catch::Internal::Operator)0,curi_status>
          (ExpressionLhs<curi_status_const&> *this,curi_status *rhs)

{
  ExpressionResultBuilder *pEVar1;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pEVar1 = ExpressionResultBuilder::setResultType
                     ((ExpressionResultBuilder *)this,**(curi_status **)(this + 0x228) == *rhs);
  Detail::makeString<curi_status>(&local_38,*(curi_status **)(this + 0x228));
  pEVar1 = ExpressionResultBuilder::setLhs(pEVar1,&local_38);
  Detail::makeString<curi_status>(&local_58,rhs);
  pEVar1 = ExpressionResultBuilder::setRhs(pEVar1,&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"==",&local_79);
  pEVar1 = ExpressionResultBuilder::setOp(pEVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pEVar1;
}

Assistant:

ExpressionResultBuilder& captureExpression( const RhsT& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }